

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

double __thiscall gulps::log(gulps *this,double __x)

{
  long *plVar1;
  undefined8 *puVar2;
  char cVar3;
  iterator __end1;
  message *in_RSI;
  _List_node_base *p_Var4;
  undefined8 *puVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  message msg;
  message local_f0;
  
  message::message(&local_f0,in_RSI);
  p_Var4 = (this->outputs).
           super__List_base<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  dVar6 = extraout_XMM0_Qa;
  if (p_Var4 != (_List_node_base *)this) {
    do {
      plVar1 = *(long **)&((list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
                            *)(p_Var4 + 1))->
                          super__List_base<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
      ;
      puVar2 = (undefined8 *)plVar1[2];
      for (puVar5 = (undefined8 *)plVar1[1]; puVar5 != puVar2; puVar5 = puVar5 + 1) {
        cVar3 = (*(code *)*puVar5)(&local_f0);
        if (cVar3 != '\0') {
          dVar6 = (double)(**(code **)(*plVar1 + 0x10))(plVar1,&local_f0);
          break;
        }
        dVar6 = extraout_XMM0_Qa_00;
      }
      p_Var4 = (((list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
                  *)&p_Var4->_M_next)->
               super__List_base<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.text._M_dataplus._M_p != &local_f0.text.field_2) {
    operator_delete(local_f0.text._M_dataplus._M_p);
    dVar6 = extraout_XMM0_Qa_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.thread_id._M_dataplus._M_p != &local_f0.thread_id.field_2) {
    operator_delete(local_f0.thread_id._M_dataplus._M_p);
    dVar6 = extraout_XMM0_Qa_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.src_path._M_dataplus._M_p != &local_f0.src_path.field_2) {
    operator_delete(local_f0.src_path._M_dataplus._M_p);
    dVar6 = extraout_XMM0_Qa_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.cat_minor._M_dataplus._M_p != &local_f0.cat_minor.field_2) {
    operator_delete(local_f0.cat_minor._M_dataplus._M_p);
    dVar6 = extraout_XMM0_Qa_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.cat_major._M_dataplus._M_p != &local_f0.cat_major.field_2) {
    operator_delete(local_f0.cat_major._M_dataplus._M_p);
    dVar6 = extraout_XMM0_Qa_05;
  }
  return dVar6;
}

Assistant:

void log(message&& in_msg)
	{
		message msg = std::move(in_msg);
		
		for(std::unique_ptr<gulps_output>& out : outputs)
			out->log(msg);
	}